

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O2

char * rapidjson::internal::Prettify(char *buffer,int length,int k)

{
  int i;
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  
  uVar5 = k + length;
  if ((int)uVar5 < 0x16 && -1 < k) {
    for (lVar2 = (long)length; lVar2 < (int)uVar5; lVar2 = lVar2 + 1) {
      buffer[lVar2] = '0';
    }
    pcVar3 = buffer + (int)uVar5;
    pcVar4 = pcVar3 + 2;
    pcVar3[0] = '.';
    pcVar3[1] = '0';
  }
  else if (uVar5 - 1 < 0x15) {
    memmove(buffer + uVar5 + 1,buffer + uVar5,(long)-k);
    buffer[uVar5] = '.';
    pcVar4 = buffer + (long)length + 1;
  }
  else {
    if (5 < uVar5 + 5) {
      if (length == 1) {
        buffer[1] = 'e';
        pcVar4 = buffer + 2;
      }
      else {
        memmove(buffer + 2,buffer + 1,(long)(length + -1));
        buffer[1] = '.';
        pcVar4 = buffer + (long)length + 2;
        buffer[(long)length + 1] = 'e';
      }
      pcVar4 = WriteExponent(uVar5 - 1,pcVar4);
      return pcVar4;
    }
    uVar5 = 2 - uVar5;
    memmove(buffer + uVar5,buffer,(long)length);
    buffer[0] = '0';
    buffer[1] = '.';
    for (uVar1 = 2; uVar1 < uVar5; uVar1 = uVar1 + 1) {
      buffer[uVar1] = '0';
    }
    pcVar4 = buffer + (int)(uVar5 + length);
  }
  return pcVar4;
}

Assistant:

inline char* Prettify(char* buffer, int length, int k) {
    const int kk = length + k;  // 10^(kk-1) <= v < 10^kk

    if (length <= kk && kk <= 21) {
        // 1234e7 -> 12340000000
        for (int i = length; i < kk; i++)
            buffer[i] = '0';
        buffer[kk] = '.';
        buffer[kk + 1] = '0';
        return &buffer[kk + 2];
    }
    else if (0 < kk && kk <= 21) {
        // 1234e-2 -> 12.34
        std::memmove(&buffer[kk + 1], &buffer[kk], length - kk);
        buffer[kk] = '.';
        return &buffer[length + 1];
    }
    else if (-6 < kk && kk <= 0) {
        // 1234e-6 -> 0.001234
        const int offset = 2 - kk;
        std::memmove(&buffer[offset], &buffer[0], length);
        buffer[0] = '0';
        buffer[1] = '.';
        for (int i = 2; i < offset; i++)
            buffer[i] = '0';
        return &buffer[length + offset];
    }
    else if (length == 1) {
        // 1e30
        buffer[1] = 'e';
        return WriteExponent(kk - 1, &buffer[2]);
    }
    else {
        // 1234e30 -> 1.234e33
        std::memmove(&buffer[2], &buffer[1], length - 1);
        buffer[1] = '.';
        buffer[length + 1] = 'e';
        return WriteExponent(kk - 1, &buffer[0 + length + 2]);
    }
}